

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O0

void __thiscall icu_63::RBBITableBuilder::removeColumn(RBBITableBuilder *this,int32_t column)

{
  int32_t iVar1;
  void *pvVar2;
  RBBIStateDescriptor *sd;
  int32_t state;
  int32_t numStates;
  int32_t column_local;
  RBBITableBuilder *this_local;
  
  iVar1 = UVector::size(this->fDStates);
  for (sd._4_4_ = 0; sd._4_4_ < iVar1; sd._4_4_ = sd._4_4_ + 1) {
    pvVar2 = UVector::elementAt(this->fDStates,sd._4_4_);
    UVector32::removeElementAt(*(UVector32 **)((long)pvVar2 + 0x28),column);
  }
  return;
}

Assistant:

void RBBITableBuilder::removeColumn(int32_t column) {
    int32_t numStates = fDStates->size();
    for (int32_t state=0; state<numStates; state++) {
        RBBIStateDescriptor *sd = (RBBIStateDescriptor *)fDStates->elementAt(state);
        U_ASSERT(column < sd->fDtran->size());
        sd->fDtran->removeElementAt(column);
    }
}